

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.cc
# Opt level: O1

string_view __thiscall
bloaty::dwarf::CompilationUnitSizes::ReadInitialLength
          (CompilationUnitSizes *this,string_view *remaining)

{
  ulong uVar1;
  uint *puVar2;
  char *pcVar3;
  ulong uVar4;
  size_type __rlen;
  string_view sVar5;
  
  uVar1 = remaining->_M_len;
  if (3 < uVar1) {
    puVar2 = (uint *)remaining->_M_str;
    uVar4 = (ulong)*puVar2;
    remaining->_M_str = (char *)(puVar2 + 1);
    remaining->_M_len = uVar1 - 4;
    if (uVar4 == 0xffffffff) {
      this->dwarf64_ = true;
      if (uVar1 - 4 < 8) goto LAB_001b121a;
      uVar4 = *(ulong *)(puVar2 + 1);
      remaining->_M_str = (char *)(puVar2 + 3);
      remaining->_M_len = uVar1 - 0xc;
    }
    else {
      this->dwarf64_ = false;
    }
    if (uVar4 <= remaining->_M_len) {
      pcVar3 = remaining->_M_str;
      remaining->_M_len = remaining->_M_len - uVar4;
      remaining->_M_str = pcVar3 + uVar4;
      sVar5._M_str = pcVar3;
      sVar5._M_len = uVar4;
      return sVar5;
    }
    Throw("short DWARF compilation unit",0x59);
  }
LAB_001b121a:
  Throw("premature EOF reading fixed-length data",0x8d);
}

Assistant:

std::string_view CompilationUnitSizes::ReadInitialLength(
    std::string_view* remaining) {
  uint64_t len = ReadFixed<uint32_t>(remaining);

  if (len == 0xffffffff) {
    dwarf64_ = true;
    len = ReadFixed<uint64_t>(remaining);
  } else {
    dwarf64_ = false;
  }

  if (remaining->size() < len) {
    THROW("short DWARF compilation unit");
  }

  std::string_view unit = *remaining;
  unit.remove_suffix(remaining->size() - len);
  *remaining = remaining->substr(len);
  return unit;
}